

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall google::protobuf::internal::SooRep::set_size(SooRep *this,bool is_soo,int size)

{
  bool *v1;
  bool *v2;
  LogMessage *pLVar1;
  anon_enum_32 *v2_00;
  undefined1 auVar2 [16];
  LogMessageFatal local_70 [23];
  Voidify local_59;
  anon_enum_32 local_58;
  int local_54;
  string *local_50;
  string *absl_log_internal_check_op_result_1;
  undefined8 local_40;
  LogMessageFatal local_38 [22];
  Voidify local_22;
  bool local_21;
  string *local_20;
  string *absl_log_internal_check_op_result;
  int size_local;
  bool is_soo_local;
  SooRep *this_local;
  
  absl_log_internal_check_op_result._0_4_ = size;
  absl_log_internal_check_op_result._7_1_ = is_soo;
  _size_local = this;
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue<bool>
                 ((bool *)((long)&absl_log_internal_check_op_result + 7));
  local_21 = SooRep::is_soo(this);
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue<bool>(&local_21);
  local_20 = absl::lts_20240722::log_internal::Check_EQImpl<bool,bool>
                       (v1,v2,"is_soo == this->is_soo()");
  if (local_20 != (string *)0x0) {
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
    local_40 = auVar2._8_8_;
    absl_log_internal_check_op_result_1 = auVar2._0_8_;
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0xd0,absl_log_internal_check_op_result_1,local_40);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_22,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
  }
  if ((absl_log_internal_check_op_result._7_1_ & 1) == 0) {
    (this->field_0).long_rep.size = (int)absl_log_internal_check_op_result;
  }
  else {
    local_54 = absl::lts_20240722::log_internal::GetReferenceableValue
                         ((int)absl_log_internal_check_op_result);
    local_58 = kSooSizeMask;
    v2_00 = absl::lts_20240722::log_internal::GetReferenceableValue<google::protobuf::internal::__0>
                      (&local_58);
    local_50 = absl::lts_20240722::log_internal::Check_LEImpl<int,google::protobuf::internal::__0>
                         (&local_54,v2_00,"size <= kSooSizeMask");
    if (local_50 != (string *)0x0) {
      auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_70,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
                 ,0xd2,auVar2._0_8_,auVar2._8_8_);
      pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_70);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_59,pLVar1);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_70);
    }
    (this->field_0).long_rep.elements_int =
         (this->field_0).long_rep.elements_int & 0xfffffffffffffff8;
    (this->field_0).long_rep.elements_int =
         (long)(int)absl_log_internal_check_op_result | (this->field_0).long_rep.elements_int;
  }
  return;
}

Assistant:

void set_size(bool is_soo, int size) {
    ABSL_DCHECK_EQ(is_soo, this->is_soo());
    if (is_soo) {
      ABSL_DCHECK_LE(size, kSooSizeMask);
      short_rep.arena_and_size &= kSooPtrMask;
      short_rep.arena_and_size |= size;
    } else {
      long_rep.size = size;
    }
  }